

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case2516(ParserTester *this)

{
  ParseOptions parseOpts;
  Expectation *pEVar1;
  ParseOptions local_1f8;
  string local_1d8;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"continue ;",&local_31);
  Expectation::Expectation(&local_1b8);
  std::__cxx11::string::string
            ((string *)&local_1d8,
             (string *)
             &Parser::DiagnosticsReporter::ID_of_ExpectedFIRSTofDirectDeclarator_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1b8,Error,&local_1d8);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions(&local_1f8);
  parseOpts.langExts_.translations_.field_0 = local_1f8.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_1f8.langDialect_.std_;
  parseOpts._1_7_ = local_1f8._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_1f8.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_1f8.field_2;
  parseOpts._26_6_ = local_1f8._26_6_;
  parse(this,&local_30,&local_100,Any,parseOpts);
  Expectation::~Expectation(&local_100);
  std::__cxx11::string::~string((string *)&local_1d8);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case2516()
{
    parse("continue ;",
          Expectation().diagnostic(Expectation::ErrorOrWarn::Error,
                                   Parser::DiagnosticsReporter::ID_of_ExpectedFIRSTofDirectDeclarator));
}